

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O1

void __thiscall
GlobOpt::CSEAddInstr
          (GlobOpt *this,BasicBlock *block,Instr *instr,Value *dstVal,Value *src1Val,Value *src2Val,
          Value *dstIndirIndexVal,Value *src1IndirIndexVal)

{
  GlobOptBlockData *this_00;
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  bool bVar5;
  BailOutKind BVar6;
  undefined4 *puVar7;
  StackSym *pSVar8;
  Value **ppVVar9;
  RegOpnd *pRVar10;
  ulong uVar11;
  ValueInfo *this_01;
  GlobOpt *this_02;
  ExprAttributes exprAttributes;
  Opnd *pOVar12;
  int32 local_5c;
  Value *pVStack_58;
  int32 intConstantValue;
  BasicBlock *local_50;
  Value *local_48;
  Value *local_40;
  ExprHash local_34 [2];
  ExprHash hash;
  
  local_34[0] = (ExprHash)((uint)local_34[0] & 0xffffff00);
  this_02 = this;
  pVStack_58 = src2Val;
  local_50 = block;
  local_48 = src1Val;
  local_40 = dstVal;
  bVar3 = DoCSE(this);
  if (!bVar3) {
    return;
  }
  OVar1 = instr->m_opcode;
  if (OVar1 < Neg_I4) {
    if (OVar1 == LdElemI_A) {
LAB_0049e32b:
      pOVar12 = instr->m_src1;
      OVar4 = IR::Opnd::GetKind(pOVar12);
      dstIndirIndexVal = src1IndirIndexVal;
      if (OVar4 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar3) goto LAB_0049e726;
LAB_0049e38d:
        *puVar7 = 0;
      }
LAB_0049e395:
      this_00 = &local_50->globOptData;
      local_48 = GlobOptBlockData::FindValue(this_00,(Sym *)pOVar12[1]._vptr_Opnd[2]);
      if (dstIndirIndexVal == (Value *)0x0) {
        if (*(long *)&pOVar12[1].m_valueType == 0) goto LAB_0049e417;
        dstIndirIndexVal =
             GlobOptBlockData::FindValue(this_00,*(Sym **)(*(long *)&pOVar12[1].m_valueType + 0x10))
        ;
      }
      bVar3 = ValueType::IsLikelyOptimizedVirtualTypedArray(&local_48->valueInfo->super_ValueType);
      if (bVar3) {
        bVar3 = (*(ushort *)&instr->field_0x36 >> 0xe & 1) == 0;
        exprAttributes.attributes = bVar3 + 2;
        if ((short)*(ushort *)&instr->field_0x36 < 0) {
          exprAttributes.attributes = (uint)bVar3;
        }
      }
      else {
        exprAttributes.attributes = 0;
      }
      bVar5 = true;
      bVar3 = true;
      pVStack_58 = dstIndirIndexVal;
    }
    else {
      if ((OVar1 != StElemI_A) && (exprAttributes.attributes = 0, OVar1 != StElemI_A_Strict))
      goto LAB_0049e209;
      bVar3 = CanCSEArrayStore(this_02,instr);
      if (bVar3) {
        pOVar12 = instr->m_dst;
        OVar4 = IR::Opnd::GetKind(pOVar12);
        if (OVar4 != OpndKindIndir) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
          if (!bVar3) goto LAB_0049e726;
          local_40 = local_48;
          goto LAB_0049e38d;
        }
        local_40 = local_48;
        goto LAB_0049e395;
      }
LAB_0049e417:
      exprAttributes.attributes = 0;
      bVar5 = false;
      bVar3 = false;
    }
joined_r0x0049e315:
    if (!bVar3) {
      return;
    }
  }
  else {
    uVar11 = (ulong)(OVar1 - 0x1be);
    if (OVar1 - 0x1be < 0x23) {
      if ((0x41edUL >> (uVar11 & 0x3f) & 1) == 0) {
        if ((0x600000000U >> (uVar11 & 0x3f) & 1) != 0) {
          bVar3 = IRType_IsUnsignedInt(instr->m_dst->m_type);
          bVar5 = IRType_IsUnsignedInt(instr->m_src1->m_type);
          exprAttributes.attributes = bVar3 + 2;
          if (!bVar5) {
            exprAttributes.attributes = (uint)bVar3;
          }
          goto LAB_0049e209;
        }
        if (uVar11 != 4) goto LAB_0049e2ed;
        if (((((instr->field_0x38 & 0x10) != 0) &&
             (BVar6 = IR::Instr::GetBailOutKind(instr), (BVar6 >> 0xb & 1) != 0)) &&
            (bVar3 = IR::Instr::ShouldCheckFor32BitOverflow(instr), !bVar3)) &&
           (instr->ignoreOverflowBitCount != '5')) {
          return;
        }
      }
      exprAttributes.attributes = *(uint *)&this->field_0xf4 >> 2 & 3;
    }
    else {
LAB_0049e2ed:
      if ((OVar1 - 0x25e < 7) && ((0x43U >> (OVar1 - 0x25e & 0x1f) & 1) != 0)) {
        bVar3 = IR::Instr::ShouldCheckForNegativeZero(instr);
        exprAttributes.attributes = 0;
        bVar5 = false;
        goto joined_r0x0049e315;
      }
      exprAttributes.attributes = 0;
      if (OVar1 == LdArrViewElem) goto LAB_0049e32b;
    }
LAB_0049e209:
    bVar5 = false;
  }
  if (instr->m_dst == (Opnd *)0x0) {
    this_01 = (ValueInfo *)0x0;
  }
  else {
    if (local_40 == (Value *)0x0) {
      return;
    }
    this_01 = local_40->valueInfo;
    if (this_01->symStore == (Sym *)0x0) {
      if (!bVar5) {
        return;
      }
      bVar3 = ValueInfo::HasIntConstantValue(this_01,false);
      if (!bVar3) {
        return;
      }
      bVar3 = ValueType::IsIntAndLikelyTagged(&this_01->super_ValueType);
      if (!bVar3) {
        return;
      }
      OVar4 = IR::Opnd::GetKind(instr->m_src1);
      if (OVar4 != OpndKindAddr) {
        return;
      }
    }
  }
  bVar3 = GetHash(this,instr,local_48,pVStack_58,exprAttributes,local_34);
  if (bVar3) {
    if (((this_01 != (ValueInfo *)0x0) && (this_01->symStore == (Sym *)0x0)) &&
       (bVar3 = ValueInfo::TryGetIntConstantValue(this_01,&local_5c,false), bVar3)) {
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                           ,0x137,"(isArray)","isArray");
        if (!bVar3) goto LAB_0049e726;
        *puVar7 = 0;
      }
      bVar3 = ValueType::IsIntAndLikelyTagged(&this_01->super_ValueType);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                           ,0x138,"(valueInfo->IsIntAndLikelyTagged())",
                           "valueInfo->IsIntAndLikelyTagged()");
        if (!bVar3) goto LAB_0049e726;
        *puVar7 = 0;
      }
      OVar4 = IR::Opnd::GetKind(instr->m_src1);
      if (OVar4 != OpndKindAddr) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                           ,0x139,"(instr->GetSrc1()->IsAddrOpnd())",
                           "instr->GetSrc1()->IsAddrOpnd()");
        if (!bVar3) {
LAB_0049e726:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      pSVar8 = GetOrCreateTaggedIntConstantStackSym(this,local_5c);
      IR::Instr::HoistSrc1(instr,Ld_A,RegNOREG,pSVar8);
      GlobOptBlockData::SetValue(&this->currentBlock->globOptData,local_40,&pSVar8->super_Sym);
    }
    ppVVar9 = ValueHashTable<ExprHash,_Value_*>::FindOrInsertNew
                        ((local_50->globOptData).exprToValueMap,local_34[0]);
    *ppVVar9 = local_40;
    if (bVar5) {
      BVSparse<Memory::JitArenaAllocator>::Set
                ((local_50->globOptData).liveArrayValues,(BVIndex)local_34[0]);
    }
    bVar3 = MayNeedBailOnImplicitCall(instr,local_48,pVStack_58);
    if (bVar3) {
      (this->currentBlock->globOptData).hasCSECandidates = true;
      pOVar12 = instr->m_src1;
      if (pOVar12 != (Opnd *)0x0) {
        OVar4 = IR::Opnd::GetKind(pOVar12);
        if (OVar4 == OpndKindReg) {
          pRVar10 = IR::Opnd::AsRegOpnd(pOVar12);
          pSVar8 = pRVar10->m_sym;
          if ((pSVar8->field_0x1a & 1) != 0) {
            pSVar8 = StackSym::GetVarEquivSym(pSVar8,this->func);
          }
          BVSparse<Memory::JitArenaAllocator>::Set
                    ((local_50->globOptData).liveFields,(pSVar8->super_Sym).m_id);
        }
        pOVar12 = instr->m_src2;
        if ((pOVar12 != (Opnd *)0x0) && (OVar4 = IR::Opnd::GetKind(pOVar12), OVar4 == OpndKindReg))
        {
          pRVar10 = IR::Opnd::AsRegOpnd(pOVar12);
          pSVar8 = pRVar10->m_sym;
          if ((pSVar8->field_0x1a & 1) != 0) {
            pSVar8 = StackSym::GetVarEquivSym(pSVar8,this->func);
          }
          BVSparse<Memory::JitArenaAllocator>::Set
                    ((local_50->globOptData).liveFields,(pSVar8->super_Sym).m_id);
        }
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::CSEAddInstr(
    BasicBlock *block,
    IR::Instr *instr,
    Value *dstVal,
    Value *src1Val,
    Value *src2Val,
    Value *dstIndirIndexVal,
    Value *src1IndirIndexVal)
{
    ExprAttributes exprAttributes;
    ExprHash hash;

    if (!this->DoCSE())
    {
        return;
    }

    bool isArray = false;

    switch(instr->m_opcode)
    {
    case Js::OpCode::LdElemI_A:
    case Js::OpCode::LdArrViewElem:
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
    {
        // For arrays, hash the value # of the baseOpnd and indexOpnd
        IR::IndirOpnd *arrayOpnd;
        Value *indirIndexVal;
        if (instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict)
        {
            if (!this->CanCSEArrayStore(instr))
            {
                return;
            }
            dstVal = src1Val;
            arrayOpnd = instr->GetDst()->AsIndirOpnd();
            indirIndexVal = dstIndirIndexVal;
        }
        else
        {
            // all the LdElem and Ld*ArrViewElem
            arrayOpnd = instr->GetSrc1()->AsIndirOpnd();
            indirIndexVal = src1IndirIndexVal;
        }

        src1Val = block->globOptData.FindValue(arrayOpnd->GetBaseOpnd()->m_sym);
        if(indirIndexVal)
        {
            src2Val = indirIndexVal;
        }
        else if (arrayOpnd->GetIndexOpnd())
        {
            src2Val = block->globOptData.FindValue(arrayOpnd->GetIndexOpnd()->m_sym);
        }
        else
        {
            return;
        }
        isArray = true;

        // for typed array do not add instructions whose dst are guaranteed to be int or number
        // as we will try to eliminate bound check for these typed arrays
        if (src1Val->GetValueInfo()->IsLikelyOptimizedVirtualTypedArray())
        {
            exprAttributes = DstIsIntOrNumberAttributes(!instr->dstIsAlwaysConvertedToInt32, !instr->dstIsAlwaysConvertedToNumber);
        }
        break;
    }

    case Js::OpCode::Mul_I4:
        // If int32 overflow is ignored, we only add MULs with 53-bit overflow check to expr map
        if (instr->HasBailOutInfo() && (instr->GetBailOutKind() & IR::BailOutOnMulOverflow) &&
            !instr->ShouldCheckFor32BitOverflow() && instr->ignoreOverflowBitCount != 53)
        {
            return;
        }

        // fall-through

    case Js::OpCode::Neg_I4:
    case Js::OpCode::Add_I4:
    case Js::OpCode::Sub_I4:
    case Js::OpCode::DivU_I4:
    case Js::OpCode::Div_I4:
    case Js::OpCode::RemU_I4:
    case Js::OpCode::Rem_I4:
    case Js::OpCode::ShrU_I4:
    {
        // Can't CSE and Add where overflow doesn't matter (and no bailout) with one where it does matter... Record whether int
        // overflow or negative zero were ignored.
        exprAttributes = IntMathExprAttributes(ignoredIntOverflowForCurrentInstr, ignoredNegativeZeroForCurrentInstr);
        break;
    }

    case Js::OpCode::InlineMathFloor:
    case Js::OpCode::InlineMathCeil:
    case Js::OpCode::InlineMathRound:
        if (!instr->ShouldCheckForNegativeZero())
        {
            return;
        }
        break;

    case Js::OpCode::Conv_Prim:
    case Js::OpCode::Conv_Prim_Sat:
        exprAttributes = ConvAttributes(instr->GetDst()->IsUnsigned(), instr->GetSrc1()->IsUnsigned());
        break;
    }

    ValueInfo *valueInfo = NULL;

    if (instr->GetDst())
    {
        if (!dstVal)
        {
            return;
        }

        valueInfo = dstVal->GetValueInfo();
        if(valueInfo->GetSymStore() == NULL &&
            !(isArray && valueInfo->HasIntConstantValue() && valueInfo->IsIntAndLikelyTagged() && instr->GetSrc1()->IsAddrOpnd()))
        {
            return;
        }
    }

    if (!this->GetHash(instr, src1Val, src2Val, exprAttributes, &hash))
    {
        return;
    }

    int32 intConstantValue;
    if(valueInfo && !valueInfo->GetSymStore() && valueInfo->TryGetIntConstantValue(&intConstantValue))
    {
        Assert(isArray);
        Assert(valueInfo->IsIntAndLikelyTagged());
        Assert(instr->GetSrc1()->IsAddrOpnd());

        // We need a sym associated with a value in the expression value table. Hoist the address into a stack sym associated
        // with the int constant value.
        StackSym *const constStackSym = GetOrCreateTaggedIntConstantStackSym(intConstantValue);
        instr->HoistSrc1(Js::OpCode::Ld_A, RegNOREG, constStackSym);
        currentBlock->globOptData.SetValue(dstVal, constStackSym);
    }

    // We have a candidate.  Add it to the exprToValueMap.
    Value ** pVal = block->globOptData.exprToValueMap->FindOrInsertNew(hash);
    *pVal = dstVal;

    if (isArray)
    {
        block->globOptData.liveArrayValues->Set(hash);
    }

    if (MayNeedBailOnImplicitCall(instr, src1Val, src2Val))
    {
        this->currentBlock->globOptData.hasCSECandidates = true;

        // Use LiveFields to track is object.valueOf/toString could get overridden.
        IR::Opnd *src1 = instr->GetSrc1();
        if (src1)
        {
            if (src1->IsRegOpnd())
            {
                StackSym *varSym = src1->AsRegOpnd()->m_sym;

                if (varSym->IsTypeSpec())
                {
                    varSym = varSym->GetVarEquivSym(this->func);
                }
                block->globOptData.liveFields->Set(varSym->m_id);
            }
            IR::Opnd *src2 = instr->GetSrc2();
            if (src2 && src2->IsRegOpnd())
            {
                StackSym *varSym = src2->AsRegOpnd()->m_sym;

                if (varSym->IsTypeSpec())
                {
                    varSym = varSym->GetVarEquivSym(this->func);
                }
                block->globOptData.liveFields->Set(varSym->m_id);
            }
        }
    }
}